

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Frame::CopyFrom(Frame *this,Frame *frame)

{
  bool bVar1;
  uint64_t uVar2;
  uint8_t *puVar3;
  int64_t iVar4;
  Frame *in_RSI;
  Frame *in_RDI;
  uint64_t in_stack_ffffffffffffffc8;
  uint8_t *in_stack_ffffffffffffffd0;
  uint8_t *additional;
  
  additional = in_RDI->frame_;
  if (additional != (uint8_t *)0x0) {
    operator_delete__(additional);
  }
  in_RDI->frame_ = (uint8_t *)0x0;
  in_RDI->length_ = 0;
  uVar2 = length(in_RSI);
  if ((uVar2 != 0) && (puVar3 = Frame::frame(in_RSI), puVar3 != (uint8_t *)0x0)) {
    in_stack_ffffffffffffffd0 = Frame::frame(in_RSI);
    length(in_RSI);
    bVar1 = Init(in_RDI,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (!bVar1) {
      return false;
    }
  }
  in_RDI->add_id_ = 0;
  if (in_RDI->additional_ != (uint8_t *)0x0) {
    operator_delete__(in_RDI->additional_);
  }
  in_RDI->additional_ = (uint8_t *)0x0;
  in_RDI->additional_length_ = 0;
  uVar2 = additional_length(in_RSI);
  if ((uVar2 != 0) && (puVar3 = Frame::additional(in_RSI), puVar3 != (uint8_t *)0x0)) {
    Frame::additional(in_RSI);
    additional_length(in_RSI);
    add_id(in_RSI);
    bVar1 = AddAdditionalData(in_RSI,additional,(uint64_t)in_RDI,(uint64_t)in_stack_ffffffffffffffd0
                             );
    if (!bVar1) {
      return false;
    }
  }
  uVar2 = duration(in_RSI);
  in_RDI->duration_ = uVar2;
  bVar1 = duration_set(in_RSI);
  in_RDI->duration_set_ = bVar1;
  bVar1 = is_key(in_RSI);
  in_RDI->is_key_ = bVar1;
  uVar2 = track_number(in_RSI);
  in_RDI->track_number_ = uVar2;
  uVar2 = timestamp(in_RSI);
  in_RDI->timestamp_ = uVar2;
  iVar4 = discard_padding(in_RSI);
  in_RDI->discard_padding_ = iVar4;
  iVar4 = reference_block_timestamp(in_RSI);
  in_RDI->reference_block_timestamp_ = iVar4;
  bVar1 = reference_block_timestamp_set(in_RSI);
  in_RDI->reference_block_timestamp_set_ = bVar1;
  return true;
}

Assistant:

bool Frame::CopyFrom(const Frame& frame) {
  delete[] frame_;
  frame_ = NULL;
  length_ = 0;
  if (frame.length() > 0 && frame.frame() != NULL &&
      !Init(frame.frame(), frame.length())) {
    return false;
  }
  add_id_ = 0;
  delete[] additional_;
  additional_ = NULL;
  additional_length_ = 0;
  if (frame.additional_length() > 0 && frame.additional() != NULL &&
      !AddAdditionalData(frame.additional(), frame.additional_length(),
                         frame.add_id())) {
    return false;
  }
  duration_ = frame.duration();
  duration_set_ = frame.duration_set();
  is_key_ = frame.is_key();
  track_number_ = frame.track_number();
  timestamp_ = frame.timestamp();
  discard_padding_ = frame.discard_padding();
  reference_block_timestamp_ = frame.reference_block_timestamp();
  reference_block_timestamp_set_ = frame.reference_block_timestamp_set();
  return true;
}